

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vitals.c
# Opt level: O1

int mmk_memcmp(void *s1,void *s2,size_t n)

{
  size_t sVar1;
  char *s2_;
  char *s1_;
  
  if (n != 0) {
    sVar1 = 0;
    do {
      if (*(char *)((long)s1 + sVar1) != *(char *)((long)s2 + sVar1)) {
        return (uint)(*(char *)((long)s2 + sVar1) <= *(char *)((long)s1 + sVar1)) * 2 + -1;
      }
      sVar1 = sVar1 + 1;
    } while (n != sVar1);
  }
  return 0;
}

Assistant:

int mmk_memcmp(const void *s1, const void *s2, size_t n)
{
    for (const char *s1_ = s1, *s2_ = s2; n; ++s1_, ++s2_, --n)
        if (*s1_ != *s2_)
            return *s1_ < *s2_ ? -1 : 1;
    return 0;
}